

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFunctionDecPOMDPDiscrete.cpp
# Opt level: O2

double __thiscall
ValueFunctionDecPOMDPDiscrete::CalculateVsjohRecursively<true>
          (ValueFunctionDecPOMDPDiscrete *this,Index sI,Index johI,Index stage)

{
  DecPOMDPDiscreteInterface *pDVar1;
  MultiAgentDecisionProcessDiscreteInterface *pMVar2;
  int iVar3;
  Index JOHI;
  Index sucSI;
  Index sI_00;
  ulong uVar4;
  Index joI;
  uint joI_00;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool valid;
  bool local_5d;
  Index local_5c;
  double local_58;
  double local_50;
  Index local_44;
  double local_40;
  double local_38;
  undefined1 auVar5 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  iVar3 = (*(this->_m_jpol->super_JointPolicyDiscrete).super_JointPolicy._vptr_JointPolicy[0x11])
                    (this->_m_jpol,(ulong)johI);
  pDVar1 = this->_m_pu->_m_DecPOMDP;
  local_5c = sI;
  local_58 = (double)(**(code **)(*(long *)pDVar1 + 0xc0))(pDVar1,sI,iVar3);
  if ((ulong)stage < this->_m_h - 1) {
    local_44 = stage + 1;
    local_50 = 0.0;
    uVar4 = 0;
    while (sI_00 = (Index)uVar4, uVar4 < this->_m_nrS) {
      pMVar2 = (this->_m_pu->super_PlanningUnitMADPDiscrete)._m_madp;
      local_40 = (double)(**(code **)((long)*pMVar2 + 0x108))(pMVar2,local_5c,iVar3,uVar4);
      joI_00 = 0;
      while ((ulong)joI_00 < this->_m_nrJO) {
        pMVar2 = (this->_m_pu->super_PlanningUnitMADPDiscrete)._m_madp;
        local_38 = (double)(**(code **)((long)*pMVar2 + 0x118))(pMVar2,iVar3,uVar4,joI_00);
        JOHI = PlanningUnitMADPDiscrete::GetSuccessorJOHI
                         (&this->_m_pu->super_PlanningUnitMADPDiscrete,johI,joI_00);
        local_5d = false;
        auVar6._0_8_ = GetCached(this,sI_00,JOHI,&local_5d);
        auVar6._8_56_ = extraout_var;
        auVar5 = auVar6._0_16_;
        if (local_5d == false) {
          auVar7._0_8_ = CalculateVsjohRecursively<true>(this,sI_00,JOHI,local_44);
          auVar7._8_56_ = extraout_var_00;
          auVar5 = auVar7._0_16_;
        }
        auVar9._8_8_ = 0;
        auVar9._0_8_ = local_50;
        joI_00 = joI_00 + 1;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = local_38 * local_40;
        auVar5 = vfmadd231sd_fma(auVar9,auVar5,auVar8);
        local_50 = auVar5._0_8_;
      }
      uVar4 = (ulong)(sI_00 + 1);
    }
    local_58 = local_58 + local_50;
    SetCached(this,local_5c,johI,local_58);
  }
  return local_58;
}

Assistant:

double ValueFunctionDecPOMDPDiscrete::CalculateVsjohRecursively(Index sI,Index johI, Index stage)
{
#if DEBUG_CALCV
    std::cout<< "\nValueFunctionDecPOMDPDiscrete::CalculateVsjohRecursively("
             << sI << ", " << johI << ") called"<<std::endl;
#endif

    Index jaI = GetJPol()->GetJointActionIndex(johI);
    double R = _m_pu->GetReward(sI, jaI);
    double ExpFutureR = 0.0;
    // horizon h policy makes decision on observation histories which 
    // maximally have length h-1. 
    // t=0 - () - length=0 
    // ... 
    // t=h-1 - (o1,...,o{h-1}) - length h-1
    if( ( CACHED && stage >= _m_h - 1) ||
        (!CACHED && _m_pu->GetTimeStepForJOHI(johI) >= _m_h - 1 ) )
    {
#if DEBUG_CALCV
        std::cout << "ValueFunctionDecPOMDPDiscrete::CalculateVsjoh"
                  << "Recursively("<< sI <<", " << johI << ") - V="<<R<<std::endl;
#endif
        return(R);
    }

#if DEBUG_CALCV
    std::cout << "Calculating future reward"<<std::endl;
#endif
    for(Index sucSI = 0; sucSI < _m_nrS; sucSI++)
    {
        double probSucSI = _m_pu->GetTransitionProbability(sI, jaI,sucSI);
#if DEBUG_CALCV
        std::cout << "P(s"<<sucSI<<"|s"<<sI<<",ja"<<jaI<<")="<<probSucSI<<std::endl;
#endif

        for(Index joI = 0; joI < _m_nrJO; joI++)
        {
            double probJOI =  _m_pu->GetObservationProbability(jaI, sucSI, joI);
#if DEBUG_CALCV
            std::cout << "P(jo"<<joI<<"|ja"<<jaI<<",s"<<sucSI<<")="<<probJOI<<std::endl;
#endif
            Index sucJohI = _m_pu->GetSuccessorJOHI(johI, joI);

            double thisSucV;
            bool valid=false;
            if (CACHED)
                thisSucV=GetCached(sucSI,sucJohI,valid); // read from cache
            if (!valid) // if not found in cache or cache is not used
                thisSucV=CalculateVsjohRecursively<CACHED>(sucSI,sucJohI,stage+1);
            ExpFutureR += probSucSI * probJOI * thisSucV;
        }//end for each observation
    }//end for each potential succesor state
    double val = R + ExpFutureR;
    if (CACHED)
        SetCached(sI, johI, val); // write to cache
#if DEBUG_CALCV
    std::cout << "ValueFunctionDecPOMDPDiscrete::CalculateVsjohRecursively("
              << sI <<", " << johI << ") \n->immediate R="<<R
              << " \n->exp. future reward="<<ExpFutureR<<"\n->V="<<val<<std::endl;
#endif
    return(val);
}